

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppillr.cpp
# Opt level: O2

bool parse_options(int argc,char **argv,Options *options)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  size_type sVar1;
  bool bVar2;
  int iVar3;
  istream *piVar4;
  long lVar5;
  char *__s1;
  Options *pOVar6;
  int iVar7;
  string line;
  ifstream f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [31];
  
  this = &options->parse_files;
  iVar7 = 1;
  do {
    if (argc <= iVar7) {
LAB_001041d8:
      return argc <= iVar7;
    }
    __s1 = argv[iVar7];
    sVar1 = (options->command)._M_string_length;
    if (*__s1 == '-') {
      if (sVar1 == 0) {
        std::__cxx11::string::assign((char *)options);
        __s1 = argv[iVar7];
        if (*__s1 == '-') goto LAB_00103f18;
        bVar2 = false;
      }
      else {
LAB_00103f18:
        bVar2 = true;
        if ((__s1[1] == 'h') && (__s1[2] == '\0')) {
          printf("%s [-h] [directory | files.cpp]",*argv);
          goto LAB_001041d8;
        }
      }
      iVar3 = strcmp(__s1,"-filelist");
      if (iVar3 == 0) {
        iVar7 = iVar7 + 1;
        if (iVar7 < argc) {
          std::ifstream::ifstream
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                     argv[iVar7],_S_in);
          line._M_dataplus._M_p = (pointer)&line.field_2;
          line._M_string_length = 0;
          line.field_2._M_local_buf[0] = '\0';
          while (piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                    ((istream *)&f,(string *)&line),
                ((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(this,&line);
          }
          std::__cxx11::string::~string((string *)&line);
          std::ifstream::~ifstream
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f);
        }
      }
      else {
        iVar3 = strcmp(__s1,"-print");
        if (iVar3 == 0) {
          iVar7 = iVar7 + 1;
          pOVar6 = (Options *)&options->print;
          if (iVar7 < argc) goto LAB_00104127;
        }
        else {
          iVar3 = strcmp(__s1,"-showtime");
          if (iVar3 == 0) {
            options->show_time = true;
          }
          else {
            iVar3 = strcmp(__s1,"-showtokens");
            if (iVar3 == 0) {
              options->show_tokens = true;
            }
            else {
              iVar3 = strcmp(__s1,"-showast");
              if (iVar3 == 0) {
                options->show_ast = true;
              }
              else {
                iVar3 = strcmp(__s1,"-showincludes");
                if (iVar3 == 0) {
                  options->show_includes = true;
                }
                else {
                  iVar3 = strcmp(__s1,"-showfunctions");
                  if (iVar3 == 0) {
                    options->show_functions = true;
                  }
                  else {
                    iVar3 = strcmp(__s1,"-counttokens");
                    if (iVar3 == 0) {
                      options->count_tokens = true;
                    }
                    else {
                      iVar3 = strcmp(__s1,"-countlines");
                      if (iVar3 == 0) {
                        options->count_lines = true;
                      }
                      else {
                        iVar3 = strcmp(__s1,"-keywordstats");
                        if (iVar3 == 0) {
                          options->keyword_stats = true;
                        }
                        else {
                          iVar3 = strcmp(__s1,"-threads");
                          if (iVar3 != 0) {
                            if (((bVar2) && (__s1[1] == '-')) && (__s1[2] == '\0')) {
                              _f = (pointer)local_228;
                              local_228[0]._M_local_buf[0] = '\0';
                              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                              ::emplace_back<std::__cxx11::string>
                                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                          *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&f);
                              iVar7 = iVar7 + 1;
                              goto LAB_00103f4a;
                            }
                            printf("%s: invalid argument %s\n",*argv,__s1);
                            goto LAB_001041d8;
                          }
                          iVar7 = iVar7 + 1;
                          if (iVar7 < argc) {
                            lVar5 = strtol(argv[iVar7],(char **)0x0,10);
                            options->threads = (int)lVar5;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      pOVar6 = options;
      if (sVar1 == 0) {
LAB_00104127:
        std::__cxx11::string::assign((char *)pOVar6);
      }
      else {
        std::__cxx11::string::string((string *)&f,__s1,(allocator *)&line);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f);
LAB_00103f4a:
        std::__cxx11::string::~string((string *)&f);
      }
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

bool parse_options(int argc, char* argv[], Options& options)
{
  for (int i=1; i<argc; ++i) {
    // Ignore empty args?
    if (argv[i][0] != '-') {
      if (options.command.empty())
        options.command = argv[i];
      else
        options.parse_files.push_back(argv[i]);
      continue;
    }
    else if (options.command.empty()) {
      options.command = "none";
    }

    if (std::strcmp(argv[i], "-h") == 0) {
      std::printf("%s [-h] [directory | files.cpp]",
                  argv[0]);
      return false;
    }
    else if (std::strcmp(argv[i], "-filelist") == 0) {
      ++i;
      if (i < argc) {
        std::ifstream f(argv[i]);
        std::string line;
        while (std::getline(f, line)) {
          options.parse_files.push_back(line);
        }
      }
    }
    else if (std::strcmp(argv[i], "-print") == 0) {
      ++i;
      if (i < argc) {
        options.print = argv[i];
      }
    }
    else if (std::strcmp(argv[i], "-showtime") == 0) {
      options.show_time = true;
    }
    else if (std::strcmp(argv[i], "-showtokens") == 0) {
      options.show_tokens = true;
    }
    else if (std::strcmp(argv[i], "-showast") == 0) {
      options.show_ast = true;
    }
    else if (std::strcmp(argv[i], "-showincludes") == 0) {
      options.show_includes = true;
    }
    else if (std::strcmp(argv[i], "-showfunctions") == 0) {
      options.show_functions = true;
    }
    else if (std::strcmp(argv[i], "-counttokens") == 0) {
      options.count_tokens = true;
    }
    else if (std::strcmp(argv[i], "-countlines") == 0) {
      options.count_lines = true;
    }
    else if (std::strcmp(argv[i], "-keywordstats") == 0) {
      options.keyword_stats = true;
    }
    else if (std::strcmp(argv[i], "-threads") == 0) {
      ++i;
      if (i < argc) {
        options.threads = std::strtol(argv[i], nullptr, 10);
      }
    }
    else if (std::strcmp(argv[i], "--") == 0) {
      ++i;
      options.parse_files.push_back(std::string()); // parse stdin
    }
    else {
      std::printf("%s: invalid argument %s\n", argv[0], argv[i]);
      return false;
    }
  }
  return true;
}